

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_knull(jit_State *J,IRType t)

{
  IRIns *pIVar1;
  IRRef1 *pIVar2;
  uint uVar3;
  ulong uVar4;
  
  pIVar1 = (J->cur).ir;
  pIVar2 = J->chain + 0x1b;
  do {
    uVar4 = (ulong)*pIVar2;
    uVar3 = (uint)*pIVar2;
    if (uVar4 == 0) {
      uVar3 = (J->cur).nk;
      if (uVar3 <= J->irbotlim) {
        lj_ir_growbot(J);
        pIVar1 = (J->cur).ir;
      }
      uVar3 = uVar3 - 1;
      uVar4 = (ulong)uVar3;
      (J->cur).nk = uVar3;
      pIVar1[uVar4].field_1.op12 = 0;
      *(char *)((long)pIVar1 + uVar4 * 8 + 4) = (char)t;
      *(undefined1 *)((long)pIVar1 + uVar4 * 8 + 5) = 0x1b;
      *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = J->chain[0x1b];
      J->chain[0x1b] = (IRRef1)uVar3;
      break;
    }
    pIVar2 = &(&pIVar1->field_0)[uVar4].prev;
  } while ((&pIVar1->field_1)[uVar4].t.irt != t);
  return t * 0x1000000 + uVar3;
}

Assistant:

TRef lj_ir_knull(jit_State *J, IRType t)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KNULL]; ref; ref = cir[ref].prev)
    if (irt_t(cir[ref].t) == t)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = 0;
  ir->t.irt = (uint8_t)t;
  ir->o = IR_KNULL;
  ir->prev = J->chain[IR_KNULL];
  J->chain[IR_KNULL] = (IRRef1)ref;
found:
  return TREF(ref, t);
}